

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_error_offset(sqlite3 *db)

{
  u8 uVar1;
  int iVar2;
  
  iVar2 = -1;
  if (db != (sqlite3 *)0x0) {
    uVar1 = db->eOpenState;
    if (((uVar1 == 'm') || (uVar1 == 'v')) || (uVar1 == 0xba)) {
      if (db->errCode != 0) {
        if (db->mutex == (sqlite3_mutex *)0x0) {
          iVar2 = db->errByteOffset;
        }
        else {
          (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
          iVar2 = db->errByteOffset;
          if (db->mutex != (sqlite3_mutex *)0x0) {
            (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
          }
        }
      }
    }
    else {
      sqlite3_log(0x15,"API call with %s database connection pointer","invalid");
    }
  }
  return iVar2;
}

Assistant:

SQLITE_API int sqlite3_error_offset(sqlite3 *db){
  int iOffset = -1;
  if( db && sqlite3SafetyCheckSickOrOk(db) && db->errCode ){
    sqlite3_mutex_enter(db->mutex);
    iOffset = db->errByteOffset;
    sqlite3_mutex_leave(db->mutex);
  }
  return iOffset;
}